

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

BBox * __thiscall CMU462::Edge::bounds(BBox *__return_storage_ptr__,Edge *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  BBox local_60;
  
  BBox::BBox(__return_storage_ptr__);
  p_Var1 = (this->_halfedge)._M_node;
  p_Var2 = p_Var1[3]._M_prev;
  p_Var1 = p_Var1[1]._M_prev[3]._M_prev;
  if (*(char *)&p_Var2[0xc]._M_next == '\0') {
    (*(code *)(p_Var2[1]._M_next)->_M_prev)(&local_60,p_Var2 + 1);
    BBox::expand(__return_storage_ptr__,&local_60);
  }
  if (*(char *)&p_Var1[0xc]._M_next == '\0') {
    (*(code *)(p_Var1[1]._M_next)->_M_prev)(&local_60,p_Var1 + 1);
    BBox::expand(__return_storage_ptr__,&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Edge::bounds() const
  {
    BBox box;

    FaceCIter f0 = halfedge()->face();
    FaceCIter f1 = halfedge()->twin()->face();

    if( !f0->isBoundary() ) box.expand( f0->bounds() );
    if( !f1->isBoundary() ) box.expand( f1->bounds() );

    return box;
  }